

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O1

void print<ft::stack<double,ft::deque<double,ft::allocator<double>>>>
               (stack<double,_ft::deque<double,_ft::allocator<double>_>_> *t,char *s)

{
  pointer *ppvVar1;
  size_type *psVar2;
  map_pointer ppvVar3;
  long lVar4;
  undefined8 in_RAX;
  size_t sVar5;
  pointer pvVar6;
  undefined8 uStack_38;
  
  lVar4 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar4 + -0x18) + 0x1100b0);
  }
  else {
    sVar5 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).m_size != 0) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      pvVar6 = (t->c).m_finish.m_cur;
      if (pvVar6 == (t->c).m_finish.m_first) {
        pvVar6 = (t->c).m_finish.m_node[-1] + 0x20;
      }
      std::ostream::_M_insert<double>(pvVar6[-1]);
      if ((t->c).m_finish.m_cur == (t->c).m_finish.m_first) {
        ppvVar3 = (t->c).m_finish.m_node;
        (t->c).m_finish.m_node = ppvVar3 + -1;
        pvVar6 = ppvVar3[-1];
        (t->c).m_finish.m_first = pvVar6;
        pvVar6 = pvVar6 + 0x20;
        (t->c).m_finish.m_last = pvVar6;
        (t->c).m_finish.m_cur = pvVar6;
      }
      ppvVar1 = &(t->c).m_finish.m_cur;
      *ppvVar1 = *ppvVar1 + -1;
      psVar2 = &(t->c).m_size;
      *psVar2 = *psVar2 - 1;
    } while (*psVar2 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}